

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenemanager.cpp
# Opt level: O3

SceneManager * SceneManager::getInstance(void)

{
  _Rb_tree_header *p_Var1;
  
  if (instance == (SceneManager *)0x0) {
    instance = (SceneManager *)operator_new(0x38);
    p_Var1 = &(instance->scenes)._M_t._M_impl.super__Rb_tree_header;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(instance->scenes)._M_t._M_impl = 0;
    *(undefined8 *)&(instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    instance->currentScene = (Scene *)0x0;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (instance->scenes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  return instance;
}

Assistant:

SceneManager * SceneManager::getInstance()
{
	if (instance == NULL) {
		instance = new SceneManager();
	}

	return instance;
}